

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-file.c
# Opt level: O0

int lws_plat_read_file(char *filename,void *buf,int len)

{
  int __fd;
  ssize_t sVar1;
  int fd;
  int n;
  int len_local;
  void *buf_local;
  char *filename_local;
  
  __fd = lws_open(filename,0);
  if (__fd == -1) {
    filename_local._4_4_ = -1;
  }
  else {
    sVar1 = read(__fd,buf,(long)len);
    filename_local._4_4_ = (int)sVar1;
    close(__fd);
  }
  return filename_local._4_4_;
}

Assistant:

int
lws_plat_read_file(const char *filename, void *buf, int len)
{
	int n, fd = lws_open(filename, O_RDONLY);
	if (fd == -1)
		return -1;

	n = read(fd, buf, len);
	close(fd);

	return n;
}